

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int archive_read_format_rar_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  CPpmd7 *p;
  CPpmd7z_RangeDec *rc;
  rar_br *br;
  byte bVar1;
  rar *rar;
  rar *rar_00;
  byte *pbVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uchar *puVar9;
  void *pvVar10;
  undefined8 uVar11;
  unsigned_long uVar12;
  long lVar13;
  char *pcVar14;
  long lVar15;
  void *pvVar16;
  uint uVar17;
  byte bVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  size_t local_38;
  
  pvVar10 = a->format->data;
  if (*(int *)((long)pvVar10 + 0x4ee8) == -1) {
    *(undefined4 *)((long)pvVar10 + 0x4ee8) = 0;
  }
  if (0 < *(long *)((long)pvVar10 + 0x98)) {
    __archive_read_consume(a,*(long *)((long)pvVar10 + 0x98));
    *(undefined8 *)((long)pvVar10 + 0x98) = 0;
  }
  if ((*(char *)((long)pvVar10 + 0xe5) != '\0') ||
     (*(long *)((long)pvVar10 + 0x28) <= *(long *)((long)pvVar10 + 0xc0))) {
    *buff = (void *)0x0;
    *size = 0;
    lVar3 = *(long *)((long)pvVar10 + 0xb0);
    *offset = lVar3;
    lVar13 = *(long *)((long)pvVar10 + 0x28);
    if (*(long *)((long)pvVar10 + 0x28) < lVar3) {
      lVar13 = lVar3;
    }
    *offset = lVar13;
    return 1;
  }
  if (4 < *(byte *)((long)pvVar10 + 0x17) - 0x31) {
    if (*(byte *)((long)pvVar10 + 0x17) == 0x30) {
      pbVar2 = (byte *)a->format->data;
      if ((*(long *)(pbVar2 + 0xa0) == 0) && (((*pbVar2 & 1) == 0 || ((pbVar2[0x18] & 2) == 0)))) {
        *buff = (void *)0x0;
        *size = 0;
        *offset = *(int64_t *)(pbVar2 + 0xb0);
        if (*(long *)(pbVar2 + 8) == *(long *)(pbVar2 + 0xe8)) {
          pbVar2[0xe5] = 1;
          return 1;
        }
        pcVar14 = "File CRC error";
      }
      else {
        pvVar10 = rar_read_ahead(a,1,(ssize_t *)&local_38);
        *buff = pvVar10;
        if (0 < (long)local_38) {
          *size = local_38;
          lVar3 = *(long *)(pbVar2 + 0xb0);
          *offset = lVar3;
          *(size_t *)(pbVar2 + 0xb0) = lVar3 + local_38;
          *(size_t *)(pbVar2 + 0xc0) = *(long *)(pbVar2 + 0xc0) + local_38;
          *(size_t *)(pbVar2 + 0xa0) = *(long *)(pbVar2 + 0xa0) - local_38;
          *(size_t *)(pbVar2 + 0x98) = local_38;
          uVar11 = crc32(*(undefined8 *)(pbVar2 + 0xe8),pvVar10);
          *(undefined8 *)(pbVar2 + 0xe8) = uVar11;
          return 0;
        }
        pcVar14 = "Truncated RAR file data";
      }
    }
    else {
      pcVar14 = "Unsupported compression method for RAR file.";
    }
    archive_set_error(&a->archive,0x54,pcVar14);
    return -0x1e;
  }
LAB_0012d452:
  rar = (rar *)a->format->data;
  p = &rar->ppmd7_context;
  rc = &rar->range_dec;
  uVar19 = 0;
  do {
    if (rar->valid == '\0') {
LAB_0012e0c4:
      iVar5 = -0x1e;
      goto LAB_0012e0c7;
    }
    if (rar->ppmd_eod != '\0') {
LAB_0012decc:
      uVar4 = rar->unp_offset;
      if ((ulong)uVar4 != 0) {
        puVar9 = rar->unp_buffer;
        *buff = puVar9;
        *size = (ulong)uVar4;
        lVar3 = rar->offset_outgoing;
        *offset = lVar3;
        rar->offset_outgoing = lVar3 + *size;
        uVar12 = crc32(rar->crc_calculated,puVar9,(int)*size);
        rar->crc_calculated = uVar12;
        rar->unp_offset = 0;
        return 0;
      }
      *buff = (void *)0x0;
      *size = 0;
      *offset = rar->offset;
      if (rar->file_crc == rar->crc_calculated) {
        rar->entry_eof = '\x01';
        iVar5 = 1;
        goto LAB_0012e0c7;
      }
      pcVar14 = "File CRC error";
LAB_0012e0bd:
      archive_set_error(&a->archive,0x54,pcVar14);
      goto LAB_0012e0c4;
    }
    if (rar->dictionary_size != 0) {
      if (rar->unp_size <= rar->offset) goto LAB_0012decc;
      if ((rar->is_ppmd_block != '\0') || (uVar21 = rar->bytes_uncopied, (long)uVar21 < 1))
      goto LAB_0012d4d3;
      uVar19 = (ulong)(rar->unp_buffer_size - rar->unp_offset);
      if (uVar21 < uVar19) {
        uVar19 = uVar21;
      }
      uVar4 = copy_from_lzss_window(a,buff,rar->offset,(int)uVar19);
      if (uVar4 == 0) {
        rar->offset = rar->offset + uVar19;
        rar->bytes_uncopied = rar->bytes_uncopied - uVar19;
        pvVar16 = *buff;
        if (pvVar16 != (void *)0x0) {
          rar->unp_offset = 0;
          *size = (ulong)rar->unp_buffer_size;
          lVar3 = rar->offset_outgoing;
          *offset = lVar3;
          rar->offset_outgoing = lVar3 + *size;
          uVar12 = crc32(rar->crc_calculated,pvVar16,(int)*size);
          rar->crc_calculated = uVar12;
          return 0;
        }
        pvVar16 = (void *)0x0;
        uVar19 = 0;
        goto LAB_0012ddd2;
      }
LAB_0012dfe4:
      uVar19 = (ulong)uVar4;
      goto LAB_0012dfe7;
    }
LAB_0012d4d3:
    if (((rar->br).next_in == (uchar *)0x0) &&
       (uVar19 = 0, 0 < *(long *)((long)a->format->data + 0xa0))) {
      puVar9 = (uchar *)rar_read_ahead(a,1,&(rar->br).avail_in);
      (rar->br).next_in = puVar9;
      if (puVar9 == (uchar *)0x0) {
        pcVar14 = "Truncated RAR file data";
        goto LAB_0012e0bd;
      }
      if ((rar->br).cache_avail == 0) {
        rar_br_fillup(a,&rar->br);
      }
    }
    if (rar->start_new_table != '\0') {
      uVar4 = parse_codes(a);
      uVar19 = (ulong)uVar4;
      if (-0x15 < (int)uVar4) goto LAB_0012d4fe;
      goto LAB_0012dfe7;
    }
LAB_0012d4fe:
    if (rar->is_ppmd_block == '\0') {
      lVar3 = rar->offset;
      lVar13 = (ulong)rar->dictionary_size + lVar3;
      rar->filterstart = 0x7fffffffffffffff;
      rar_00 = (rar *)a->format->data;
      br = &rar_00->br;
      if (rar_00->filterstart < lVar13) {
        lVar13 = rar_00->filterstart;
      }
LAB_0012d64c:
      while( true ) {
        if (rar_00->output_last_match != '\0') {
          uVar19 = (rar_00->lzss).position;
          if (lVar13 < (long)(rar_00->lastlength + uVar19)) goto LAB_0012dd6a;
          lzss_emit_match(rar_00,rar_00->lastoffset,rar_00->lastlength);
          rar_00->output_last_match = '\0';
        }
        uVar19 = (rar_00->lzss).position;
        if ((rar_00->is_ppmd_block != '\0') || (lVar13 <= (long)uVar19)) goto LAB_0012dd6a;
        uVar4 = read_next_symbol(a,&rar_00->maincode);
        if ((int)uVar4 < 0) goto LAB_0012e0c4;
        rar_00->output_last_match = '\0';
        if (0xff < uVar4) break;
        lzss_emit_literal(rar_00,(uint8_t)uVar4);
      }
      if (uVar4 != 0x100) {
        if (uVar4 == 0x102) break;
        if (uVar4 == 0x101) goto switchD_0012d55f_caseD_3;
        if (0x106 < uVar4) {
          if (uVar4 < 0x10f) {
            bVar18 = *(byte *)((long)&expand_shortbases + (ulong)(uVar4 - 0x107));
            bVar1 = *(byte *)((long)&expand_shortbits + (ulong)(uVar4 - 0x107));
            iVar5 = (rar_00->br).cache_avail;
            if (iVar5 < (int)(uint)bVar1) {
              iVar6 = rar_br_fillup(a,br);
              iVar5 = (rar_00->br).cache_avail;
              if ((iVar6 == 0) && (iVar5 < (int)(uint)bVar1)) goto LAB_0012e068;
            }
            uVar19 = (rar_00->br).cache_buffer;
            iVar5 = iVar5 - (uint)bVar1;
            uVar4 = cache_masks[bVar1];
            (rar_00->br).cache_avail = iVar5;
            for (lVar15 = 0; lVar15 != -3; lVar15 = lVar15 + -1) {
              rar_00->oldoffset[lVar15 + 3] = rar_00->oldoffset[lVar15 + 2];
            }
            uVar17 = bVar18 + 1 + (uVar4 & (uint)(uVar19 >> ((byte)iVar5 & 0x3f)));
            rar_00->oldoffset[0] = uVar17;
            uVar4 = 2;
            goto LAB_0012dbbf;
          }
          if (uVar4 < 300) {
            uVar4 = uVar4 - 0x10f;
            iVar5 = (byte)expand_lengthbases[uVar4] + 3;
            if (7 < uVar4) {
              bVar18 = expand_lengthbits[uVar4];
              iVar6 = (rar_00->br).cache_avail;
              if (iVar6 < (int)(uint)bVar18) {
                iVar20 = rar_br_fillup(a,br);
                iVar6 = (rar_00->br).cache_avail;
                if ((iVar20 == 0) && (iVar6 < (int)(uint)bVar18)) goto LAB_0012e068;
              }
              iVar6 = iVar6 - (uint)bVar18;
              iVar5 = ((uint)((rar_00->br).cache_buffer >> ((byte)iVar6 & 0x3f)) &
                      cache_masks[bVar18]) + iVar5;
              (rar_00->br).cache_avail = iVar6;
            }
            uVar4 = read_next_symbol(a,&rar_00->offsetcode);
            if (uVar4 < 0x3d) {
              uVar19 = (ulong)uVar4;
              uVar17 = *(int *)(expand_offsetbases + uVar19 * 4) + 1;
              if (3 < uVar4) {
                bVar18 = expand_offsetbits[uVar19];
                if (uVar4 < 10) {
                  iVar6 = (rar_00->br).cache_avail;
                  if (iVar6 < (int)(uint)bVar18) {
                    iVar20 = rar_br_fillup(a,br);
                    iVar6 = (rar_00->br).cache_avail;
                    if ((iVar20 == 0) && (iVar6 < (int)(uint)bVar18)) goto LAB_0012e068;
                  }
                  iVar6 = iVar6 - (uint)bVar18;
                  uVar17 = ((uint)((rar_00->br).cache_buffer >> ((byte)iVar6 & 0x3f)) &
                           cache_masks[bVar18]) + uVar17;
                  (rar_00->br).cache_avail = iVar6;
                }
                else {
                  if (uVar19 - 0xc < 0x30) {
                    iVar6 = (rar_00->br).cache_avail;
                    iVar20 = bVar18 - 4;
                    if (iVar6 < iVar20) {
                      iVar8 = rar_br_fillup(a,br);
                      iVar6 = (rar_00->br).cache_avail;
                      if ((iVar8 == 0) && (iVar6 < iVar20)) goto LAB_0012e068;
                    }
                    uVar17 = ((uint)((rar_00->br).cache_buffer >> ((byte)(iVar6 - iVar20) & 0x3f)) &
                             (&UINT_001629b0)[bVar18]) * 0x10 + uVar17;
                    (rar_00->br).cache_avail = iVar6 - iVar20;
                  }
                  if (rar_00->numlowoffsetrepeats == 0) {
                    uVar4 = read_next_symbol(a,&rar_00->lowoffsetcode);
                    if ((int)uVar4 < 0) goto LAB_0012e0c4;
                    if (uVar4 != 0x10) {
                      uVar17 = uVar17 + uVar4;
                      rar_00->lastlowoffset = uVar4;
                      goto LAB_0012db7b;
                    }
                    rar_00->numlowoffsetrepeats = 0xf;
                  }
                  else {
                    rar_00->numlowoffsetrepeats = rar_00->numlowoffsetrepeats - 1;
                  }
                  uVar17 = uVar17 + rar_00->lastlowoffset;
                }
              }
LAB_0012db7b:
              for (lVar15 = 0; lVar15 != -3; lVar15 = lVar15 + -1) {
                rar_00->oldoffset[lVar15 + 3] = rar_00->oldoffset[lVar15 + 2];
              }
              uVar4 = (uint)(0x1fff < (int)uVar17) + iVar5 + (uint)(0x3ffff < (int)uVar17);
              goto LAB_0012dbb8;
            }
          }
LAB_0012e05f:
          pcVar14 = "Bad RAR file data";
          goto LAB_0012e0bd;
        }
        uVar19 = (ulong)(uVar4 - 0x103);
        uVar17 = rar_00->oldoffset[uVar19];
        uVar7 = read_next_symbol(a,&rar_00->lengthcode);
        if (0x1c < uVar7) goto LAB_0012e05f;
        uVar4 = (byte)expand_lengthbases[uVar7] + 2;
        if (7 < uVar7) {
          bVar18 = expand_lengthbits[uVar7];
          iVar5 = (rar_00->br).cache_avail;
          if (iVar5 < (int)(uint)bVar18) {
            iVar6 = rar_br_fillup(a,br);
            iVar5 = (rar_00->br).cache_avail;
            if ((iVar6 == 0) && (iVar5 < (int)(uint)bVar18)) goto LAB_0012e068;
          }
          iVar5 = iVar5 - (uint)bVar18;
          uVar4 = ((uint)((rar_00->br).cache_buffer >> ((byte)iVar5 & 0x3f)) & cache_masks[bVar18])
                  + uVar4;
          (rar_00->br).cache_avail = iVar5;
        }
        for (; 0 < (int)uVar19; uVar19 = uVar19 - 1) {
          rar_00->oldoffset[uVar19] = rar_00->oldoffset[uVar19 - 1];
        }
LAB_0012dbb8:
        rar_00->oldoffset[0] = uVar17;
        goto LAB_0012dbbf;
      }
      iVar5 = (rar_00->br).cache_avail;
      if (iVar5 < 1) {
        iVar6 = rar_br_fillup(a,br);
        iVar5 = (rar_00->br).cache_avail;
        if (iVar5 < 1 && iVar6 == 0) goto LAB_0012e068;
      }
      uVar19 = (rar_00->br).cache_buffer;
      uVar4 = iVar5 - 1;
      (rar_00->br).cache_avail = uVar4;
      if ((uVar19 >> ((ulong)uVar4 & 0x3f) & 1) != 0) {
        iVar5 = parse_codes(a);
        if (iVar5 != 0) goto LAB_0012e0c4;
        goto LAB_0012d64c;
      }
      rar_00->start_new_block = '\x01';
      if (iVar5 < 2) {
        iVar5 = rar_br_fillup(a,br);
        uVar4 = (rar_00->br).cache_avail;
        if ((int)uVar4 < 1 && iVar5 == 0) {
LAB_0012e068:
          archive_set_error(&a->archive,0x54,"Truncated RAR file data");
          rar_00->valid = '\0';
          goto LAB_0012e0c4;
        }
        uVar19 = br->cache_buffer;
      }
      rar_00->start_new_table = (uVar19 >> ((ulong)(uVar4 - 1) & 0x3f) & 1) != 0;
      (rar_00->br).cache_avail = uVar4 - 1;
      uVar19 = (rar_00->lzss).position;
LAB_0012dd6a:
      if ((long)uVar19 < 0) goto LAB_0012dfe7;
      uVar19 = uVar19 - lVar3;
      rar->bytes_uncopied = uVar19;
      if (uVar19 == 0) {
        pcVar14 = "Internal error extracting RAR file";
        goto LAB_0012e0bd;
      }
    }
    else {
      iVar5 = Ppmd7_DecodeSymbol(p,&rc->p);
      if (iVar5 < 0) {
LAB_0012df93:
        pcVar14 = "Invalid symbol";
        goto LAB_0012e0bd;
      }
      if (iVar5 != rar->ppmd_escape) {
switchD_0012d55f_caseD_1:
        lzss_emit_literal(rar,(uint8_t)iVar5);
        uVar19 = 1;
        goto LAB_0012dbf6;
      }
      iVar6 = Ppmd7_DecodeSymbol(p,&rc->p);
      if (iVar6 < 0) goto LAB_0012df93;
      switch(iVar6) {
      case 0:
        goto switchD_0012d55f_caseD_0;
      default:
        goto switchD_0012d55f_caseD_1;
      case 2:
        rar->ppmd_eod = '\x01';
        goto LAB_0012ddca;
      case 3:
switchD_0012d55f_caseD_3:
        archive_set_error(&a->archive,-1,"Parsing filters is unsupported.");
        iVar5 = -0x19;
        goto LAB_0012e0c7;
      case 4:
        uVar4 = 0;
        bVar18 = 0x10;
        for (iVar5 = 2; iVar6 = Ppmd7_DecodeSymbol(p,&rc->p), -1 < iVar5; iVar5 = iVar5 + -1) {
          if (iVar6 < 0) goto LAB_0012df2f;
          uVar4 = uVar4 | iVar6 << (bVar18 & 0x1f);
          bVar18 = bVar18 - 8;
        }
        if (iVar6 < 0) {
LAB_0012df2f:
          pcVar14 = "Invalid symbol";
          goto LAB_0012e0bd;
        }
        uVar19 = (ulong)(iVar6 + 0x20U);
        lzss_emit_match(rar,uVar4 + 2,iVar6 + 0x20U);
        break;
      case 5:
        iVar5 = Ppmd7_DecodeSymbol(p,&rc->p);
        if (iVar5 < 0) goto LAB_0012df93;
        uVar19 = (ulong)(iVar5 + 4U);
        lzss_emit_match(rar,1,iVar5 + 4U);
      }
LAB_0012dbf6:
      uVar19 = uVar19 + rar->bytes_uncopied;
      rar->bytes_uncopied = uVar19;
    }
    uVar21 = (ulong)(rar->unp_buffer_size - rar->unp_offset);
    if ((long)uVar19 < (long)uVar21) {
      uVar21 = uVar19;
    }
    uVar4 = copy_from_lzss_window(a,buff,rar->offset,(int)uVar21);
    if (uVar4 != 0) goto LAB_0012dfe4;
    rar->offset = rar->offset + uVar21;
    rar->bytes_uncopied = rar->bytes_uncopied - uVar21;
    uVar19 = 0;
LAB_0012ddca:
    pvVar16 = *buff;
LAB_0012ddd2:
    if (pvVar16 != (void *)0x0) {
      rar->unp_offset = 0;
      *size = (ulong)rar->unp_buffer_size;
      lVar3 = rar->offset_outgoing;
      *offset = lVar3;
      rar->offset_outgoing = lVar3 + *size;
      uVar12 = crc32(rar->crc_calculated,pvVar16,(int)*size);
      rar->crc_calculated = uVar12;
LAB_0012dfe7:
      iVar5 = (int)uVar19;
      if (iVar5 == -0x14) {
        return -0x14;
      }
      if (iVar5 == 0) {
        return 0;
      }
LAB_0012e0c7:
      Ppmd7_Free((CPpmd7 *)((long)pvVar10 + 0x370),&g_szalloc);
      return iVar5;
    }
  } while( true );
  uVar4 = rar_00->lastlength;
  if (uVar4 == 0) goto LAB_0012d64c;
  uVar17 = rar_00->lastoffset;
LAB_0012dbbf:
  rar_00->lastoffset = uVar17;
  rar_00->lastlength = uVar4;
  rar_00->output_last_match = '\x01';
  goto LAB_0012d64c;
switchD_0012d55f_caseD_0:
  rar->start_new_table = '\x01';
  goto LAB_0012d452;
}

Assistant:

static int
archive_read_format_rar_read_data(struct archive_read *a, const void **buff,
                                  size_t *size, int64_t *offset)
{
  struct rar *rar = (struct rar *)(a->format->data);
  int ret;

  if (rar->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
	  rar->has_encrypted_entries = 0;
  }

  if (rar->bytes_unconsumed > 0) {
      /* Consume as much as the decompressor actually used. */
      __archive_read_consume(a, rar->bytes_unconsumed);
      rar->bytes_unconsumed = 0;
  }

  if (rar->entry_eof || rar->offset_seek >= rar->unp_size) {
    *buff = NULL;
    *size = 0;
    *offset = rar->offset;
    if (*offset < rar->unp_size)
      *offset = rar->unp_size;
    return (ARCHIVE_EOF);
  }

  switch (rar->compression_method)
  {
  case COMPRESS_METHOD_STORE:
    ret = read_data_stored(a, buff, size, offset);
    break;

  case COMPRESS_METHOD_FASTEST:
  case COMPRESS_METHOD_FAST:
  case COMPRESS_METHOD_NORMAL:
  case COMPRESS_METHOD_GOOD:
  case COMPRESS_METHOD_BEST:
    ret = read_data_compressed(a, buff, size, offset);
    if (ret != ARCHIVE_OK && ret != ARCHIVE_WARN)
      __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context, &g_szalloc);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unsupported compression method for RAR file.");
    ret = ARCHIVE_FATAL;
    break;
  }
  return (ret);
}